

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kubernetes.hpp
# Opt level: O1

void sendNodesToSlack(string *hostname,string *channelName)

{
  pointer pcVar1;
  Slacking *pSVar2;
  char *pcVar3;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init_00;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init_01;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init_02;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init_03;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init_04;
  string currentNodeInfo;
  vector<Node_*,_std::allocator<Node_*>_> nodeList;
  Kube currentKube;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_168;
  undefined1 local_158 [16];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_148;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_108 [2];
  vector<Node_*,_std::allocator<Node_*>_> local_e8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_d0 [3];
  undefined1 local_a0 [72];
  vector<Node_*,_std::allocator<Node_*>_> local_58;
  
  pcVar1 = (hostname->_M_dataplus)._M_p;
  local_a0._16_8_ = local_a0 + 0x20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_a0 + 0x10),pcVar1,pcVar1 + hostname->_M_string_length);
  Kube::Kube((Kube *)(local_a0 + 0x30),(string *)(local_a0 + 0x10));
  if ((undefined1 *)local_a0._16_8_ != local_a0 + 0x20) {
    operator_delete((void *)local_a0._16_8_);
  }
  std::vector<Node_*,_std::allocator<Node_*>_>::vector(&local_e8,&local_58);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"chat.postMessage","");
  local_148.m_type = null;
  local_148.m_value.object = (object_t *)0x0;
  nlohmann::detail::
  to_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_char[5],_0>
            (&local_148,(char (*) [5])"text");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&local_148);
  local_138.m_type = null;
  local_138.m_value.object = (object_t *)0x0;
  nlohmann::detail::
  to_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_char[39],_0>
            (&local_138,(char (*) [39])"*NAME : STATUS : ROLE : AGE : VERSION*");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&local_138);
  init._M_len = 2;
  init._M_array = &local_148;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_168,init,true,array);
  local_108[0].m_type = null;
  local_108[0].m_value.object = (object_t *)0x0;
  nlohmann::detail::
  to_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_char[8],_0>
            (local_108,(char (*) [8])"channel");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(local_108);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (local_108 + 1,channelName);
  init_00._M_len = 2;
  init_00._M_array = local_108;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_158,init_00,true,array);
  init_01._M_len = 2;
  init_01._M_array = &local_168;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(local_d0,init_01,true,array);
  pSVar2 = slack::_detail::instance();
  slack::_detail::Slacking::post((Slacking *)local_a0,&pSVar2->base_url,(Json *)&local_128);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_a0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(local_d0);
  lVar5 = 0x10;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)(&local_168.m_type + lVar5));
    lVar5 = lVar5 + -0x10;
  } while (lVar5 != -0x10);
  lVar5 = 0x10;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)(&local_108[0].m_type + lVar5));
    lVar5 = lVar5 + -0x10;
  } while (lVar5 != -0x10);
  lVar5 = 0x10;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)(&local_148.m_type + lVar5));
    lVar5 = lVar5 + -0x10;
  } while (lVar5 != -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar6 = 0;
    do {
      pcVar3 = (char *)std::__cxx11::string::append
                                 ((char *)local_e8.
                                          super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start[uVar6]);
      pcVar3 = (char *)std::__cxx11::string::_M_append
                                 (pcVar3,(ulong)(local_e8.
                                                 super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar6]->
                                                status)._M_dataplus._M_p);
      pcVar3 = (char *)std::__cxx11::string::append(pcVar3);
      pcVar3 = (char *)std::__cxx11::string::_M_append
                                 (pcVar3,(ulong)(local_e8.
                                                 super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar6]->
                                                role)._M_dataplus._M_p);
      pcVar3 = (char *)std::__cxx11::string::append(pcVar3);
      pcVar3 = (char *)std::__cxx11::string::_M_append
                                 (pcVar3,(ulong)(local_e8.
                                                 super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar6]->
                                                age)._M_dataplus._M_p);
      pcVar3 = (char *)std::__cxx11::string::append(pcVar3);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 (pcVar3,(ulong)(local_e8.
                                                 super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar6]->
                                                version)._M_dataplus._M_p);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_128,*plVar4,plVar4[1] + *plVar4);
      local_168._0_8_ = local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"chat.postMessage","");
      local_108[0].m_type = null;
      local_108[0].m_value.object = (object_t *)0x0;
      nlohmann::detail::
      to_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_char[5],_0>
                (local_108,(char (*) [5])"text");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant(local_108);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_108 + 1,&local_128);
      init_02._M_len = 2;
      init_02._M_array = local_108;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(&local_148,init_02,true,array);
      local_d0[0].m_type = null;
      local_d0[0].m_value.object = (object_t *)0x0;
      nlohmann::detail::
      to_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_char[8],_0>
                (local_d0,(char (*) [8])"channel");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant(local_d0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_d0 + 1,channelName);
      init_03._M_len = 2;
      init_03._M_array = local_d0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(&local_138,init_03,true,array);
      init_04._M_len = 2;
      init_04._M_array = &local_148;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(local_d0 + 2,init_04,true,array);
      pSVar2 = slack::_detail::instance();
      slack::_detail::Slacking::post
                ((Slacking *)&stack0xffffffffffffffc0,&pSVar2->base_url,&local_168);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&stack0xffffffffffffffc0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(local_d0 + 2);
      lVar5 = 0x10;
      do {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)(&local_148.m_type + lVar5));
        lVar5 = lVar5 + -0x10;
      } while (lVar5 != -0x10);
      lVar5 = 0x10;
      do {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)(&local_d0[0].m_type + lVar5));
        lVar5 = lVar5 + -0x10;
      } while (lVar5 != -0x10);
      lVar5 = 0x10;
      do {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)(&local_108[0].m_type + lVar5));
        lVar5 = lVar5 + -0x10;
      } while (lVar5 != -0x10);
      if ((undefined1 *)local_168._0_8_ != local_158) {
        operator_delete((void *)local_168._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer)local_a0._48_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._48_8_);
  }
  return;
}

Assistant:

void sendNodesToSlack(string hostname, string channelName) {
	Kube currentKube(hostname);
	vector<Node*> nodeList = currentKube.nodeList;
	slack::post (   
                		"chat.postMessage",
                	{ 
						{"text"      , "*NAME : STATUS : ROLE : AGE : VERSION*" }, 
						{"channel"   , channelName             }
                	}
       				 );

	for (int i = 0; i < nodeList.size(); i++) {
		string currentNodeInfo = nodeList[i]->name.append(" : ").append(nodeList[i]->status).append(" : ").append(nodeList[i]->role).append(" : ").append(nodeList[i]->age).append(" : ").append(nodeList[i]->version);
		slack::post (   
                		"chat.postMessage",
                	{ 
						{"text"      , currentNodeInfo }, 
						{"channel"   , channelName             }
                	}
       				 );
	}
}